

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O3

void * rw::textureClose(void *object,int32 offset,int32 size)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  
  lVar1 = (long)textureModuleOffset;
  plVar3 = (long *)(engine + lVar1 + 0x20);
  plVar2 = (long *)*plVar3;
  if (plVar2 != plVar3) {
    do {
      plVar3 = (long *)*plVar2;
      TexDictionary::destroy((TexDictionary *)(plVar2 + -4));
      lVar1 = (long)textureModuleOffset;
      plVar2 = plVar3;
    } while (plVar3 != (long *)(engine + lVar1 + 0x20));
  }
  *(undefined8 *)(engine + lVar1) = 0;
  *(undefined8 *)(engine + 8 + lVar1) = 0;
  plVar3 = (long *)(lVar1 + engine + 0x30);
  plVar2 = (long *)*plVar3;
  if (plVar2 != plVar3) {
    do {
      plVar3 = (long *)*plVar2;
      printf("Tex still allocated: %d %s %s\n",(ulong)*(uint *)((long)plVar2 + -4),plVar2 + -9,
             plVar2 + -5);
      Texture::destroy((Texture *)(plVar2 + -0xd));
      plVar2 = plVar3;
    } while (plVar3 != (long *)(engine + textureModuleOffset + 0x30));
  }
  return object;
}

Assistant:

static void*
textureClose(void *object, int32 offset, int32 size)
{
	FORLIST(lnk, TEXTUREGLOBAL(texDicts))
		TexDictionary::fromLink(lnk)->destroy();
	TEXTUREGLOBAL(initialTexDict) = nil;
	TEXTUREGLOBAL(currentTexDict) = nil;

	FORLIST(lnk, TEXTUREGLOBAL(textures)){
		Texture *tex = LLLinkGetData(lnk, Texture, inGlobalList);
		printf("Tex still allocated: %d %s %s\n", tex->refCount, tex->name, tex->mask);
		assert(tex->dict == nil);
		tex->destroy();
	}
	return object;
}